

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O2

void Js::JavascriptArray::InternalCopyNativeIntArrayElements
               (JavascriptArray *dstArray,uint32 dstIndex,JavascriptNativeIntArray *srcArray,
               uint32 start,uint32 end)

{
  code *pcVar1;
  bool bVar2;
  uint32 uVar3;
  uint uVar4;
  undefined4 *puVar5;
  uint32 count;
  undefined1 local_60 [8];
  ArrayElementEnumerator e;
  
  if ((end <= start) ||
     ((srcArray->super_JavascriptNativeArray).super_JavascriptArray.super_ArrayObject.length < end))
  {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                ,0x2d6d,"(start < end && end <= srcArray->length)",
                                "start < end && end <= srcArray->length");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar5 = 0;
  }
  e._16_8_ = srcArray;
  ArrayElementEnumerator::ArrayElementEnumerator
            ((ArrayElementEnumerator *)local_60,(JavascriptArray *)srcArray,start,end);
  count = 0;
  while( true ) {
    bVar2 = ArrayElementEnumerator::MoveNext<int>((ArrayElementEnumerator *)local_60);
    if (!bVar2) break;
    uVar3 = ArrayElementEnumerator::GetIndex((ArrayElementEnumerator *)local_60);
    uVar4 = ArrayElementEnumerator::GetItem<int>((ArrayElementEnumerator *)local_60);
    DirectSetItemAt<void*>
              (dstArray,uVar3 + (dstIndex - start),(Var)((ulong)uVar4 | 0x1000000000000));
    count = count + 1;
  }
  if (end - start != count) {
    InternalFillFromPrototype(dstArray,dstIndex,(JavascriptArray *)e._16_8_,start,end,count);
  }
  return;
}

Assistant:

void JavascriptArray::InternalCopyNativeIntArrayElements(JavascriptArray* dstArray, uint32 dstIndex, JavascriptNativeIntArray* srcArray, uint32 start, uint32 end)
    {
        Assert(start < end && end <= srcArray->length);

        uint32 count = 0;

        // iterate on the array itself
        ScriptContext *scriptContext = dstArray->GetScriptContext();

        ArrayElementEnumerator e(srcArray, start, end);
        while(e.MoveNext<int32>())
        {
            uint32 n = dstIndex + (e.GetIndex() - start);
            dstArray->DirectSetItemAt(n, JavascriptNumber::ToVar(e.GetItem<int32>(), scriptContext));
            count++;
        }

        // iterate on the array's prototypes only if not all elements found
        if (start + count != end)
        {
            InternalFillFromPrototype(dstArray, dstIndex, srcArray, start, end, count);
        }
    }